

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::KeyData::DerivePrivkey
          (KeyData *__return_storage_ptr__,KeyData *this,string *path,bool has_rebase_path)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> arr;
  bool has_rebase_path_local;
  string *path_local;
  KeyData *this_local;
  
  arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = has_rebase_path;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_60,"KeyData::DerivePrivkey",&local_61);
  ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,path,&local_60,
                    '\0');
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_90,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  DerivePrivkey(__return_storage_ptr__,this,&local_90,
                (bool)(arr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_90);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePrivkey(std::string path, bool has_rebase_path) const {
  auto arr = ToArrayFromString(path, "KeyData::DerivePrivkey", 0);
  return DerivePrivkey(arr, has_rebase_path);
}